

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DriveStrengthSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DriveStrengthSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,Token *args_3,Token *args_4)

{
  Token openParen;
  DriveStrengthSyntax *pDVar1;
  Token *in_RCX;
  Token *in_RDX;
  Token *in_R8;
  Token *in_R9;
  size_t in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  BumpAllocator *in_stack_ffffffffffffff68;
  
  pDVar1 = (DriveStrengthSyntax *)
           allocate(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  openParen.info = *(Info **)in_R9;
  openParen._0_8_ = pDVar1;
  slang::syntax::DriveStrengthSyntax::DriveStrengthSyntax
            ((DriveStrengthSyntax *)in_R8->info,openParen,*in_R9,*in_R8,*in_RCX,*in_RDX);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }